

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  ushort *puVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  char cVar5;
  BYTE BVar6;
  ushort uVar7;
  undefined8 uVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  BYTE *pBVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  ushort *puVar16;
  long lVar17;
  BYTE *pBVar18;
  long lVar19;
  ushort *puVar20;
  size_t __n;
  long lVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  uint uVar24;
  ushort *puVar25;
  BYTE *pBVar26;
  BYTE *pBVar27;
  BYTE *pBVar28;
  BYTE *pBVar29;
  long lVar30;
  char *pcVar31;
  char *pcVar32;
  ushort *puVar33;
  char *pcVar34;
  char *pcVar35;
  size_t prefixSize;
  ushort *puVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  ushort *puVar40;
  
  iVar38 = (int)dest;
  iVar11 = (int)source;
  if (dictSize == 0) {
    if (source == (char *)0x0) {
      return -1;
    }
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        return -(uint)(*source != '\0');
      }
      return -1;
    }
    if (compressedSize == 0) {
      return -1;
    }
    puVar1 = (ushort *)(source + compressedSize);
    pBVar28 = (BYTE *)(dest + maxOutputSize);
    puVar33 = (ushort *)(source + (long)compressedSize + -0x10);
    pBVar23 = (BYTE *)dest;
    if (maxOutputSize < 0x40) goto LAB_001107f5;
LAB_0011055a:
    puVar40 = (ushort *)((long)source + 1);
    bVar4 = (byte)*(ushort *)source;
    uVar37 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) {
      if ((ushort *)((long)puVar1 - 0xfU) <= puVar40) goto LAB_00110774;
      puVar25 = (ushort *)((long)source + 2);
      uVar24 = 0;
      puVar20 = (ushort *)((long)source + 0x10);
      do {
        puVar36 = puVar40;
        puVar16 = puVar20;
        puVar40 = (ushort *)((long)puVar36 + 1);
        uVar24 = uVar24 + *(byte *)((long)puVar16 + -0xf);
        puVar25 = (ushort *)((long)puVar25 + 1);
        puVar20 = (ushort *)((long)puVar16 + 1);
      } while (puVar16 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
               *(byte *)((long)puVar16 + -0xf) == 0xff);
      uVar37 = (ulong)uVar24 + 0xf;
      pBVar22 = pBVar23 + uVar37;
      if ((CARRY8((ulong)pBVar23,uVar37)) || ((ulong)-(long)puVar25 < uVar37)) {
        puVar40 = puVar16 + -7;
        goto LAB_00110774;
      }
      uVar10 = (uint)bVar4;
      if (dest + (long)maxOutputSize + -0x20 < pBVar22) goto LAB_0011086b;
      puVar20 = (ushort *)((ulong)uVar24 + (long)puVar16 + 1);
      if (puVar1 + -0x10 < puVar20) {
        puVar40 = puVar16 + -7;
        uVar10 = (uint)bVar4;
        goto LAB_0011086b;
      }
      lVar19 = 0;
      do {
        uVar8 = *(undefined8 *)((byte *)((long)puVar40 + lVar19) + 8);
        pBVar26 = pBVar23 + lVar19;
        *(undefined8 *)pBVar26 = *(undefined8 *)((long)puVar40 + lVar19);
        *(undefined8 *)(pBVar26 + 8) = uVar8;
        pbVar3 = (byte *)((long)puVar36 + lVar19 + 0x11);
        uVar8 = *(undefined8 *)(pbVar3 + 8);
        *(undefined8 *)(pBVar26 + 0x10) = *(undefined8 *)pbVar3;
        *(undefined8 *)(pBVar26 + 0x18) = uVar8;
        lVar19 = lVar19 + 0x20;
      } while (pBVar26 + 0x20 < pBVar22);
    }
    else {
      pBVar22 = pBVar23 + uVar37;
      uVar10 = (uint)bVar4;
      if ((ushort *)((long)puVar1 - 0x11U) < puVar40) goto LAB_0011086b;
      uVar8 = *(undefined8 *)((long)source + 9);
      *(undefined8 *)pBVar23 = *(undefined8 *)puVar40;
      *(undefined8 *)(pBVar23 + 8) = uVar8;
      puVar20 = (ushort *)(uVar37 + (long)puVar40);
    }
    uVar7 = *puVar20;
    uVar37 = (ulong)uVar7;
    source = (char *)(puVar20 + 1);
    pBVar26 = pBVar22 + -uVar37;
    uVar14 = (ulong)(bVar4 & 0xf);
    if (uVar14 == 0xf) {
      puVar40 = (ushort *)source;
      if (pBVar26 < dest) goto LAB_00110774;
      uVar10 = 0;
      puVar20 = (ushort *)source;
      do {
        source = (char *)((long)puVar20 + 1);
        puVar40 = (ushort *)source;
        if (puVar1 + -2 <= source) goto LAB_00110774;
        uVar9 = *puVar20;
        uVar10 = uVar10 + (byte)uVar9;
        puVar20 = (ushort *)source;
      } while ((byte)uVar9 == 0xff);
      uVar13 = (ulong)uVar10;
      if ((BYTE *)(-uVar13 - 0x10) < pBVar22) goto LAB_00110774;
      uVar14 = uVar13 + 0x13;
      if (pBVar28 + -0x40 <= pBVar22 + uVar13 + 0x13) goto LAB_0011091a;
    }
    else {
      pBVar23 = pBVar22 + uVar14 + 4;
      uVar14 = uVar14 + 4;
      if (pBVar28 + -0x40 <= pBVar23) goto LAB_0011091a;
      if ((dest <= pBVar26) && (7 < uVar7)) {
        *(undefined8 *)pBVar22 = *(undefined8 *)pBVar26;
        *(undefined8 *)(pBVar22 + 8) = *(undefined8 *)(pBVar26 + 8);
        *(undefined2 *)(pBVar22 + 0x10) = *(undefined2 *)(pBVar26 + 0x10);
        goto LAB_0011055a;
      }
    }
    puVar40 = (ushort *)source;
    if (pBVar26 < dest) goto LAB_00110774;
    pBVar23 = pBVar22 + uVar14;
    if (uVar7 < 0x10) {
      LZ4_memcpy_using_offset(pBVar22,pBVar26,pBVar23,uVar37);
    }
    else {
      do {
        uVar8 = *(undefined8 *)(pBVar22 + -uVar37 + 8);
        *(undefined8 *)pBVar22 = *(undefined8 *)(pBVar22 + -uVar37);
        *(undefined8 *)(pBVar22 + 8) = uVar8;
        uVar8 = *(undefined8 *)(pBVar22 + -uVar37 + 0x10 + 8);
        *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(pBVar22 + -uVar37 + 0x10);
        *(undefined8 *)(pBVar22 + 0x18) = uVar8;
        pBVar22 = pBVar22 + 0x20;
      } while (pBVar22 < pBVar23);
    }
    goto LAB_0011055a;
  }
  prefixSize = (size_t)dictSize;
  if (dictStart + prefixSize != dest) {
    if (source == (char *)0x0) {
      return -1;
    }
    pcVar34 = dictStart + prefixSize;
    if (dictStart == (char *)0x0) {
      pcVar34 = (char *)0x0;
    }
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        return -(uint)(*source != '\0');
      }
      return -1;
    }
    if (compressedSize == 0) {
      return -1;
    }
    puVar1 = (ushort *)(source + compressedSize);
    pBVar28 = (BYTE *)(dest + maxOutputSize);
    pBVar23 = (BYTE *)dest;
    puVar33 = (ushort *)source;
    if (maxOutputSize < 0x40) goto LAB_00111d87;
LAB_00111a93:
    puVar40 = (ushort *)((long)puVar33 + 1);
    bVar4 = (byte)*puVar33;
    uVar37 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) {
      if ((ushort *)((long)puVar1 - 0xfU) <= puVar40) goto LAB_00111d75;
      puVar20 = puVar33 + 1;
      uVar24 = 0;
      puVar33 = puVar33 + 8;
      do {
        puVar16 = puVar40;
        puVar25 = puVar33;
        puVar40 = (ushort *)((long)puVar16 + 1);
        uVar24 = uVar24 + *(byte *)((long)puVar25 + -0xf);
        puVar20 = (ushort *)((long)puVar20 + 1);
        puVar33 = (ushort *)((long)puVar25 + 1);
      } while (puVar25 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
               *(byte *)((long)puVar25 + -0xf) == 0xff);
      uVar37 = (ulong)uVar24 + 0xf;
      pBVar22 = pBVar23 + uVar37;
      if ((CARRY8((ulong)pBVar23,uVar37)) || ((ulong)-(long)puVar20 < uVar37)) {
        puVar40 = puVar25 + -7;
        goto LAB_00111d75;
      }
      uVar10 = (uint)bVar4;
      if (dest + (long)maxOutputSize + -0x20 < pBVar22) goto LAB_00111e6d;
      puVar33 = (ushort *)((ulong)uVar24 + (long)puVar25 + 1);
      if (puVar1 + -0x10 < puVar33) {
        puVar40 = puVar25 + -7;
        uVar10 = (uint)bVar4;
        goto LAB_00111e6d;
      }
      lVar19 = 0;
      do {
        uVar8 = *(undefined8 *)((byte *)((long)puVar40 + lVar19) + 8);
        pBVar26 = pBVar23 + lVar19;
        *(undefined8 *)pBVar26 = *(undefined8 *)((long)puVar40 + lVar19);
        *(undefined8 *)(pBVar26 + 8) = uVar8;
        pbVar3 = (byte *)((long)puVar16 + lVar19 + 0x11);
        uVar8 = *(undefined8 *)(pbVar3 + 8);
        *(undefined8 *)(pBVar26 + 0x10) = *(undefined8 *)pbVar3;
        *(undefined8 *)(pBVar26 + 0x18) = uVar8;
        lVar19 = lVar19 + 0x20;
      } while (pBVar26 + 0x20 < pBVar22);
    }
    else {
      pBVar22 = pBVar23 + uVar37;
      uVar10 = (uint)bVar4;
      if ((ushort *)((long)puVar1 - 0x11U) < puVar40) goto LAB_00111e6d;
      uVar8 = *(undefined8 *)((long)puVar33 + 9);
      *(undefined8 *)pBVar23 = *(undefined8 *)puVar40;
      *(undefined8 *)(pBVar23 + 8) = uVar8;
      puVar33 = (ushort *)(uVar37 + (long)puVar40);
    }
    uVar7 = *puVar33;
    uVar37 = (ulong)uVar7;
    puVar40 = puVar33 + 1;
    pBVar26 = pBVar22 + -uVar37;
    uVar14 = (ulong)(bVar4 & 0xf);
    if (uVar14 == 0xf) {
      if ((prefixSize < 0x10000) && (pBVar26 + prefixSize < dest)) goto LAB_00111d75;
      uVar10 = 0;
      puVar33 = puVar40;
      do {
        puVar40 = (ushort *)((long)puVar33 + 1);
        if (puVar1 + -2 <= puVar40) goto LAB_00111d75;
        uVar9 = *puVar33;
        uVar10 = uVar10 + (byte)uVar9;
        puVar33 = puVar40;
      } while ((byte)uVar9 == 0xff);
      uVar14 = (ulong)uVar10;
      if ((BYTE *)(-uVar14 - 0x10) < pBVar22) goto LAB_00111d75;
      __n = uVar14 + 0x13;
      if (pBVar28 + -0x40 <= pBVar22 + uVar14 + 0x13) goto LAB_00111f18;
LAB_00111c2d:
      if ((prefixSize < 0x10000) && (pBVar26 + prefixSize < dest)) goto LAB_00111d75;
      pBVar12 = pBVar22 + __n;
      pBVar23 = pBVar12;
      puVar33 = puVar40;
      if (pBVar26 < dest) {
        if (pBVar28 + -5 < pBVar12) goto LAB_00111d75;
        uVar14 = (long)dest - (long)pBVar26;
        uVar37 = __n - uVar14;
        if (__n < uVar14 || uVar37 == 0) {
          memmove(pBVar22,pcVar34 + -uVar14,__n);
        }
        else {
          memcpy(pBVar22,pcVar34 + -uVar14,uVar14);
          pBVar23 = pBVar22 + uVar14;
          pBVar22 = (BYTE *)dest;
          if ((ulong)((long)pBVar23 - (long)dest) < uVar37) {
            for (; pBVar23 < pBVar12; pBVar23 = pBVar23 + 1) {
              *pBVar23 = *pBVar22;
              pBVar22 = pBVar22 + 1;
            }
          }
          else {
            memcpy(pBVar23,dest,uVar37);
            pBVar23 = pBVar12;
          }
        }
      }
      else if (uVar7 < 0x10) {
        LZ4_memcpy_using_offset(pBVar22,pBVar26,pBVar12,uVar37);
      }
      else {
        do {
          uVar8 = *(undefined8 *)(pBVar22 + -uVar37 + 8);
          *(undefined8 *)pBVar22 = *(undefined8 *)(pBVar22 + -uVar37);
          *(undefined8 *)(pBVar22 + 8) = uVar8;
          uVar8 = *(undefined8 *)(pBVar22 + -uVar37 + 0x10 + 8);
          *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(pBVar22 + -uVar37 + 0x10);
          *(undefined8 *)(pBVar22 + 0x18) = uVar8;
          pBVar22 = pBVar22 + 0x20;
        } while (pBVar22 < pBVar12);
      }
    }
    else {
      __n = uVar14 + 4;
      if (pBVar28 + -0x40 <= pBVar22 + uVar14 + 4) goto LAB_00111f18;
      if ((pBVar26 < dest) || (uVar7 < 8)) goto LAB_00111c2d;
      *(undefined8 *)pBVar22 = *(undefined8 *)pBVar26;
      *(undefined8 *)(pBVar22 + 8) = *(undefined8 *)(pBVar26 + 8);
      *(undefined2 *)(pBVar22 + 0x10) = *(undefined2 *)(pBVar26 + 0x10);
      pBVar23 = pBVar22 + uVar14 + 4;
      puVar33 = puVar40;
    }
    goto LAB_00111a93;
  }
  if (dictSize < 0xffff) {
    iVar11 = LZ4_decompress_safe_withSmallPrefix
                       (source,dest,compressedSize,maxOutputSize,prefixSize);
    return iVar11;
  }
  iVar39 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar39 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      lVar19 = (long)maxOutputSize;
      puVar33 = (ushort *)(source + (long)compressedSize + -0x10);
      if (0x3f < maxOutputSize) {
        lVar17 = 0;
LAB_001114aa:
        pcVar34 = dest + lVar17;
        puVar40 = (ushort *)((long)source + 1);
        bVar4 = (byte)*(ushort *)source;
        uVar10 = (uint)bVar4;
        uVar37 = (ulong)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= puVar40) goto LAB_00111999;
          puVar25 = (ushort *)((long)source + 2);
          uVar24 = 0;
          puVar20 = (ushort *)((long)source + 0x10);
          do {
            puVar36 = puVar40;
            puVar16 = puVar20;
            puVar40 = (ushort *)((long)puVar36 + 1);
            uVar24 = uVar24 + *(byte *)((long)puVar16 + -0xf);
            puVar25 = (ushort *)((long)puVar25 + 1);
            puVar20 = (ushort *)((long)puVar16 + 1);
          } while (puVar16 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar16 + -0xf) == 0xff);
          uVar37 = (ulong)uVar24 + 0xf;
          if ((CARRY8((ulong)pcVar34,uVar37)) || ((ulong)-(long)puVar25 < uVar37)) {
            puVar40 = puVar16 + -7;
            goto LAB_00111999;
          }
          lVar21 = lVar17 + uVar37;
          if (dest + lVar19 + -0x20 < dest + lVar21) goto LAB_001117af;
          puVar20 = (ushort *)((ulong)uVar24 + (long)puVar16 + 1);
          if (puVar1 + -0x10 < puVar20) {
            puVar40 = puVar16 + -7;
            goto LAB_001117af;
          }
          lVar17 = 0;
          do {
            uVar8 = *(undefined8 *)((byte *)((long)puVar40 + lVar17) + 8);
            pcVar2 = pcVar34 + lVar17;
            *(undefined8 *)pcVar2 = *(undefined8 *)((long)puVar40 + lVar17);
            *(undefined8 *)(pcVar2 + 8) = uVar8;
            pbVar3 = (byte *)((long)puVar36 + lVar17 + 0x11);
            uVar8 = *(undefined8 *)(pbVar3 + 8);
            *(undefined8 *)(pcVar2 + 0x10) = *(undefined8 *)pbVar3;
            *(undefined8 *)(pcVar2 + 0x18) = uVar8;
            lVar17 = lVar17 + 0x20;
          } while (pcVar2 + 0x20 < dest + lVar21);
        }
        else {
          lVar21 = lVar17 + uVar37;
          if ((ushort *)((long)puVar1 - 0x11U) < puVar40) goto LAB_001117af;
          uVar8 = *(undefined8 *)((long)source + 9);
          *(undefined8 *)pcVar34 = *(undefined8 *)puVar40;
          *(undefined8 *)(pcVar34 + 8) = uVar8;
          puVar20 = (ushort *)(uVar37 + (long)puVar40);
        }
        pBVar28 = (BYTE *)(dest + lVar21);
        uVar7 = *puVar20;
        uVar37 = (ulong)uVar7;
        uVar24 = (uint)uVar7;
        source = (char *)(puVar20 + 1);
        lVar30 = lVar21 - uVar37;
        pBVar23 = (BYTE *)(dest + lVar30);
        uVar14 = (ulong)(bVar4 & 0xf);
        if (uVar14 == 0xf) {
          puVar40 = (ushort *)source;
          if (lVar30 < -0x10000) goto LAB_00111999;
          uVar10 = 0;
          puVar20 = (ushort *)source;
          do {
            source = (char *)((long)puVar20 + 1);
            puVar40 = (ushort *)source;
            if (puVar1 + -2 <= source) goto LAB_00111999;
            uVar9 = *puVar20;
            uVar10 = uVar10 + (byte)uVar9;
            puVar20 = (ushort *)source;
          } while ((byte)uVar9 == 0xff);
          uVar13 = (ulong)uVar10;
          if ((BYTE *)(-0x10 - uVar13) < pBVar28) goto LAB_00111999;
          uVar14 = uVar13 + 0x13;
          if (dest + lVar19 + -0x40 <= pBVar28 + uVar13 + 0x13) goto LAB_00111856;
LAB_0011164a:
          puVar40 = (ushort *)source;
          if (lVar30 < -0x10000) goto LAB_00111999;
          lVar17 = lVar21 + uVar14;
          if (uVar7 < 0x10) {
            LZ4_memcpy_using_offset(pBVar28,pBVar23,(BYTE *)(dest + lVar17),uVar37);
          }
          else {
            do {
              uVar8 = *(undefined8 *)(pBVar28 + -uVar37 + 8);
              *(undefined8 *)pBVar28 = *(undefined8 *)(pBVar28 + -uVar37);
              *(undefined8 *)(pBVar28 + 8) = uVar8;
              uVar8 = *(undefined8 *)(pBVar28 + -uVar37 + 0x10 + 8);
              *(undefined8 *)(pBVar28 + 0x10) = *(undefined8 *)(pBVar28 + -uVar37 + 0x10);
              *(undefined8 *)(pBVar28 + 0x18) = uVar8;
              pBVar28 = pBVar28 + 0x20;
            } while (pBVar28 < dest + lVar17);
          }
        }
        else {
          lVar17 = lVar21 + uVar14 + 4;
          uVar14 = uVar14 + 4;
          uVar24 = (uint)uVar7;
          if (dest + lVar19 + -0x40 <= dest + lVar17) goto LAB_00111856;
          if (uVar7 < 8) goto LAB_0011164a;
          *(undefined8 *)pBVar28 = *(undefined8 *)pBVar23;
          *(undefined8 *)(pBVar28 + 8) = *(undefined8 *)(pBVar23 + 8);
          *(undefined2 *)(pBVar28 + 0x10) = *(undefined2 *)(pBVar23 + 0x10);
        }
        goto LAB_001114aa;
      }
      lVar21 = 0;
      do {
        while( true ) {
          pcVar34 = dest + lVar21;
          puVar40 = (ushort *)((long)source + 1);
          bVar4 = (byte)*(ushort *)source;
          uVar10 = (uint)bVar4;
          uVar37 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) break;
          if ((puVar33 <= puVar40) || (dest + lVar19 + -0x20 < pcVar34)) goto LAB_001117ac;
          uVar8 = *(undefined8 *)((long)source + 9);
          *(undefined8 *)pcVar34 = *(undefined8 *)puVar40;
          *(undefined8 *)(pcVar34 + 8) = uVar8;
          lVar21 = lVar21 + uVar37;
          uVar14 = (ulong)(bVar4 & 0xf);
          source = (char *)((ushort *)((long)puVar40 + uVar37) + 1);
          uVar7 = *(ushort *)((long)puVar40 + uVar37);
          uVar24 = (uint)uVar7;
          lVar30 = lVar21 - (ulong)uVar7;
          if ((uVar14 == 0xf) || (uVar7 < 8)) goto LAB_001117fa;
          *(undefined8 *)(dest + lVar21) = *(undefined8 *)(dest + lVar30);
          *(undefined8 *)(dest + lVar21 + 8) = *(undefined8 *)(dest + lVar30 + 8);
          *(undefined2 *)(dest + lVar21 + 0x10) = *(undefined2 *)(dest + lVar30 + 0x10);
          lVar21 = lVar21 + uVar14 + 4;
        }
        if ((ushort *)((long)puVar1 - 0xfU) <= puVar40) goto LAB_00111999;
        puVar20 = (ushort *)((long)source + 2);
        uVar24 = 0;
        do {
          uVar7 = *puVar40;
          puVar40 = (ushort *)((long)puVar40 + 1);
          uVar24 = uVar24 + (byte)uVar7;
          puVar20 = (ushort *)((long)puVar20 + 1);
        } while (puVar40 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar7 == 0xff);
        uVar37 = (ulong)uVar24 + 0xf;
        if ((CARRY8((ulong)pcVar34,uVar37)) || ((ulong)-(long)puVar20 < uVar37)) goto LAB_00111999;
LAB_001117ac:
        lVar21 = lVar21 + uVar37;
LAB_001117af:
        puVar20 = (ushort *)((long)puVar40 + uVar37);
        if ((dest + lVar19 + -0xc < dest + lVar21) || (puVar1 + -4 < puVar20)) {
          if ((puVar20 == puVar1) && (lVar21 <= lVar19)) {
            memmove(pcVar34,puVar40,uVar37);
            return ((int)pcVar34 + (int)uVar37) - iVar38;
          }
LAB_00111999:
          return ~(uint)puVar40 + iVar11;
        }
        do {
          *(undefined8 *)pcVar34 = *(undefined8 *)puVar40;
          pcVar34 = pcVar34 + 8;
          puVar40 = puVar40 + 4;
        } while (pcVar34 < dest + lVar21);
        uVar24 = (uint)*puVar20;
        source = (char *)(puVar20 + 1);
        lVar30 = lVar21 - (ulong)*puVar20;
        uVar14 = (ulong)(uVar10 & 0xf);
LAB_001117fa:
        if ((int)uVar14 == 0xf) {
          uVar10 = 0;
          do {
            uVar7 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar10 = uVar10 + (byte)uVar7;
          } while ((byte)uVar7 == 0xff && source < puVar1 + -2);
          uVar14 = (ulong)uVar10 + 0xf;
          puVar40 = (ushort *)source;
          if ((puVar1 + -2 <= source) || (CARRY8((ulong)(dest + lVar21),uVar14))) goto LAB_00111999;
        }
        uVar14 = uVar14 + 4;
LAB_00111856:
        puVar40 = (ushort *)source;
        if (lVar30 < -0x10000) goto LAB_00111999;
        pcVar34 = dest + lVar21;
        pcVar31 = dest + lVar30;
        lVar21 = lVar21 + uVar14;
        pcVar2 = dest + lVar21;
        if (uVar24 < 8) {
          pcVar34[0] = '\0';
          pcVar34[1] = '\0';
          pcVar34[2] = '\0';
          pcVar34[3] = '\0';
          *pcVar34 = *pcVar31;
          pcVar34[1] = pcVar31[1];
          pcVar34[2] = pcVar31[2];
          pcVar34[3] = pcVar31[3];
          uVar37 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar24 << 2));
          *(undefined4 *)(pcVar34 + 4) = *(undefined4 *)(pcVar31 + uVar37);
          pcVar31 = pcVar31 + (uVar37 - (long)*(int *)((long)dec64table + (ulong)(uVar24 << 2)));
        }
        else {
          *(undefined8 *)pcVar34 = *(undefined8 *)pcVar31;
          pcVar31 = pcVar31 + 8;
        }
        pcVar15 = pcVar34 + 8;
        if (dest + lVar19 + -0xc < pcVar2) {
          if (dest + lVar19 + -5 < pcVar2) goto LAB_00111999;
          pcVar34 = dest + lVar19 + -7;
          pcVar32 = pcVar31;
          pcVar35 = pcVar15;
          if (pcVar15 < pcVar34) {
            do {
              *(undefined8 *)pcVar35 = *(undefined8 *)pcVar32;
              pcVar35 = pcVar35 + 8;
              pcVar32 = pcVar32 + 8;
            } while (pcVar35 < pcVar34);
            pcVar31 = pcVar31 + ((long)pcVar34 - (long)pcVar15);
            pcVar15 = pcVar34;
          }
          for (; pcVar15 < pcVar2; pcVar15 = pcVar15 + 1) {
            cVar5 = *pcVar31;
            pcVar31 = pcVar31 + 1;
            *pcVar15 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar15 = *(undefined8 *)pcVar31;
          if (0x10 < uVar14) {
            pcVar34 = pcVar34 + 0x10;
            do {
              pcVar31 = pcVar31 + 8;
              *(undefined8 *)pcVar34 = *(undefined8 *)pcVar31;
              pcVar34 = pcVar34 + 8;
            } while (pcVar34 < pcVar2);
          }
        }
      } while( true );
    }
  }
  return iVar39;
LAB_0011091a:
  puVar40 = (ushort *)source;
  if (pBVar26 < dest) {
LAB_00110774:
    return ~(uint)puVar40 + iVar11;
  }
  pBVar23 = pBVar22 + uVar14;
  if ((uint)uVar37 < 8) {
    pBVar22[0] = '\0';
    pBVar22[1] = '\0';
    pBVar22[2] = '\0';
    pBVar22[3] = '\0';
    *pBVar22 = *pBVar26;
    pBVar22[1] = pBVar26[1];
    pBVar22[2] = pBVar26[2];
    pBVar22[3] = pBVar26[3];
    uVar37 = (ulong)((uint)uVar37 << 2);
    uVar13 = (ulong)*(uint *)((long)inc32table + uVar37);
    *(undefined4 *)(pBVar22 + 4) = *(undefined4 *)(pBVar26 + uVar13);
    pBVar26 = pBVar26 + (uVar13 - (long)*(int *)((long)dec64table + uVar37));
  }
  else {
    *(undefined8 *)pBVar22 = *(undefined8 *)pBVar26;
    pBVar26 = pBVar26 + 8;
  }
  pBVar12 = pBVar22 + 8;
  if (pBVar28 + -0xc < pBVar23) {
    if (pBVar28 + -5 < pBVar23) goto LAB_00110774;
    pBVar22 = pBVar28 + -7;
    pBVar18 = pBVar26;
    pBVar27 = pBVar12;
    if (pBVar12 < pBVar22) {
      do {
        *(undefined8 *)pBVar27 = *(undefined8 *)pBVar18;
        pBVar27 = pBVar27 + 8;
        pBVar18 = pBVar18 + 8;
      } while (pBVar27 < pBVar22);
      pBVar26 = pBVar26 + ((long)pBVar22 - (long)pBVar12);
      pBVar12 = pBVar22;
    }
    for (; pBVar12 < pBVar23; pBVar12 = pBVar12 + 1) {
      BVar6 = *pBVar26;
      pBVar26 = pBVar26 + 1;
      *pBVar12 = BVar6;
    }
  }
  else {
    *(undefined8 *)pBVar12 = *(undefined8 *)pBVar26;
    if (0x10 < uVar14) {
      pBVar22 = pBVar22 + 0x10;
      do {
        pBVar26 = pBVar26 + 8;
        *(undefined8 *)pBVar22 = *(undefined8 *)pBVar26;
        pBVar22 = pBVar22 + 8;
      } while (pBVar22 < pBVar23);
    }
  }
LAB_001107f5:
  while( true ) {
    puVar40 = (ushort *)((long)source + 1);
    bVar4 = (byte)*(ushort *)source;
    uVar37 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((puVar33 <= puVar40) || (dest + (long)maxOutputSize + -0x20 < pBVar23)) goto LAB_00110867;
    uVar8 = *(undefined8 *)((long)source + 9);
    *(undefined8 *)pBVar23 = *(undefined8 *)puVar40;
    *(undefined8 *)(pBVar23 + 8) = uVar8;
    pBVar22 = pBVar23 + uVar37;
    uVar14 = (ulong)(bVar4 & 0xf);
    source = (char *)((ushort *)((long)puVar40 + uVar37) + 1);
    uVar7 = *(ushort *)((long)puVar40 + uVar37);
    uVar37 = (ulong)uVar7;
    pBVar26 = pBVar22 + -uVar37;
    if (((uVar14 == 0xf) || (uVar7 < 8)) || (pBVar26 < dest)) goto LAB_001108bc;
    *(undefined8 *)pBVar22 = *(undefined8 *)pBVar26;
    *(undefined8 *)(pBVar22 + 8) = *(undefined8 *)(pBVar26 + 8);
    *(undefined2 *)(pBVar22 + 0x10) = *(undefined2 *)(pBVar26 + 0x10);
    pBVar23 = pBVar22 + uVar14 + 4;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= puVar40) goto LAB_00110774;
  puVar20 = (ushort *)((long)source + 2);
  uVar10 = 0;
  do {
    uVar7 = *puVar40;
    puVar40 = (ushort *)((long)puVar40 + 1);
    uVar10 = uVar10 + (byte)uVar7;
    puVar20 = (ushort *)((long)puVar20 + 1);
  } while (puVar40 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar7 == 0xff);
  uVar37 = (ulong)uVar10 + 0xf;
  if ((CARRY8((ulong)pBVar23,uVar37)) || ((ulong)-(long)puVar20 < uVar37)) goto LAB_00110774;
LAB_00110867:
  pBVar22 = pBVar23 + uVar37;
  uVar10 = (uint)bVar4;
LAB_0011086b:
  puVar20 = (ushort *)((long)puVar40 + uVar37);
  if ((pBVar28 + -0xc < pBVar22) || (puVar1 + -4 < puVar20)) {
    if ((puVar20 == puVar1) && (pBVar22 <= pBVar28)) {
      memmove(pBVar23,puVar40,uVar37);
      return ((int)pBVar23 + (int)uVar37) - iVar38;
    }
    goto LAB_00110774;
  }
  do {
    *(undefined8 *)pBVar23 = *(undefined8 *)puVar40;
    pBVar23 = pBVar23 + 8;
    puVar40 = puVar40 + 4;
  } while (pBVar23 < pBVar22);
  uVar37 = (ulong)*puVar20;
  source = (char *)(puVar20 + 1);
  pBVar26 = pBVar22 + -uVar37;
  uVar14 = (ulong)(uVar10 & 0xf);
LAB_001108bc:
  if ((int)uVar14 == 0xf) {
    uVar10 = 0;
    do {
      uVar7 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar10 = uVar10 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff && source < puVar1 + -2);
    uVar14 = (ulong)uVar10 + 0xf;
    puVar40 = (ushort *)source;
    if ((puVar1 + -2 <= source) || (CARRY8((ulong)pBVar22,uVar14))) goto LAB_00110774;
  }
  uVar14 = uVar14 + 4;
  goto LAB_0011091a;
LAB_00111f18:
  if ((prefixSize < 0x10000) && (pBVar26 + prefixSize < dest)) goto LAB_00111d75;
  pBVar12 = pBVar22 + __n;
  pBVar23 = pBVar12;
  puVar33 = puVar40;
  if (pBVar26 < dest) {
    if (pBVar28 + -5 < pBVar12) goto LAB_00111d75;
    uVar14 = (long)dest - (long)pBVar26;
    uVar37 = __n - uVar14;
    if (__n < uVar14 || uVar37 == 0) {
      memmove(pBVar22,pcVar34 + -uVar14,__n);
    }
    else {
      memcpy(pBVar22,pcVar34 + -uVar14,uVar14);
      pBVar23 = pBVar22 + uVar14;
      pBVar22 = (BYTE *)dest;
      if ((ulong)((long)pBVar23 - (long)dest) < uVar37) {
        for (; pBVar23 < pBVar12; pBVar23 = pBVar23 + 1) {
          *pBVar23 = *pBVar22;
          pBVar22 = pBVar22 + 1;
        }
      }
      else {
        memcpy(pBVar23,dest,uVar37);
        pBVar23 = pBVar12;
      }
    }
  }
  else {
    if ((uint)uVar37 < 8) {
      pBVar22[0] = '\0';
      pBVar22[1] = '\0';
      pBVar22[2] = '\0';
      pBVar22[3] = '\0';
      *pBVar22 = *pBVar26;
      pBVar22[1] = pBVar26[1];
      pBVar22[2] = pBVar26[2];
      pBVar22[3] = pBVar26[3];
      uVar37 = (ulong)((uint)uVar37 << 2);
      uVar14 = (ulong)*(uint *)((long)inc32table + uVar37);
      *(undefined4 *)(pBVar22 + 4) = *(undefined4 *)(pBVar26 + uVar14);
      pBVar26 = pBVar26 + (uVar14 - (long)*(int *)((long)dec64table + uVar37));
    }
    else {
      *(undefined8 *)pBVar22 = *(undefined8 *)pBVar26;
      pBVar26 = pBVar26 + 8;
    }
    pBVar18 = pBVar22 + 8;
    if (pBVar28 + -0xc < pBVar12) {
      if (pBVar28 + -5 < pBVar12) goto LAB_00111d75;
      pBVar22 = pBVar28 + -7;
      pBVar27 = pBVar26;
      pBVar29 = pBVar18;
      if (pBVar18 < pBVar22) {
        do {
          *(undefined8 *)pBVar29 = *(undefined8 *)pBVar27;
          pBVar29 = pBVar29 + 8;
          pBVar27 = pBVar27 + 8;
        } while (pBVar29 < pBVar22);
        pBVar26 = pBVar26 + ((long)pBVar22 - (long)pBVar18);
        pBVar18 = pBVar22;
      }
      for (; pBVar18 < pBVar12; pBVar18 = pBVar18 + 1) {
        BVar6 = *pBVar26;
        pBVar26 = pBVar26 + 1;
        *pBVar18 = BVar6;
      }
    }
    else {
      *(undefined8 *)pBVar18 = *(undefined8 *)pBVar26;
      if (0x10 < __n) {
        pBVar22 = pBVar22 + 0x10;
        do {
          pBVar26 = pBVar26 + 8;
          *(undefined8 *)pBVar22 = *(undefined8 *)pBVar26;
          pBVar22 = pBVar22 + 8;
        } while (pBVar22 < pBVar12);
      }
    }
  }
LAB_00111d87:
  while( true ) {
    puVar40 = (ushort *)((long)puVar33 + 1);
    bVar4 = (byte)*puVar33;
    uVar37 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= puVar40) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar23)) goto LAB_00111e69;
    uVar8 = *(undefined8 *)((long)puVar33 + 9);
    *(undefined8 *)pBVar23 = *(undefined8 *)puVar40;
    *(undefined8 *)(pBVar23 + 8) = uVar8;
    pBVar22 = pBVar23 + uVar37;
    uVar14 = (ulong)(bVar4 & 0xf);
    puVar33 = (ushort *)(uVar37 + (long)puVar40);
    puVar40 = puVar33 + 1;
    uVar7 = *puVar33;
    uVar37 = (ulong)uVar7;
    pBVar26 = pBVar22 + -uVar37;
    if (((uVar14 == 0xf) || (uVar7 < 8)) || (pBVar26 < dest)) goto LAB_00111ebb;
    *(undefined8 *)pBVar22 = *(undefined8 *)pBVar26;
    *(undefined8 *)(pBVar22 + 8) = *(undefined8 *)(pBVar26 + 8);
    *(undefined2 *)(pBVar22 + 0x10) = *(undefined2 *)(pBVar26 + 0x10);
    pBVar23 = pBVar22 + uVar14 + 4;
    puVar33 = puVar40;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= puVar40) goto LAB_00111d75;
  puVar33 = puVar33 + 1;
  uVar10 = 0;
  do {
    uVar7 = *puVar40;
    puVar40 = (ushort *)((long)puVar40 + 1);
    uVar10 = uVar10 + (byte)uVar7;
    puVar33 = (ushort *)((long)puVar33 + 1);
  } while (puVar40 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar7 == 0xff);
  uVar37 = (ulong)uVar10 + 0xf;
  if ((CARRY8((ulong)pBVar23,uVar37)) || ((ulong)-(long)puVar33 < uVar37)) goto LAB_00111d75;
LAB_00111e69:
  pBVar22 = pBVar23 + uVar37;
  uVar10 = (uint)bVar4;
LAB_00111e6d:
  puVar33 = (ushort *)(uVar37 + (long)puVar40);
  if ((pBVar28 + -0xc < pBVar22) || (puVar1 + -4 < puVar33)) {
    if ((puVar33 == puVar1) && (pBVar22 <= pBVar28)) {
      memmove(pBVar23,puVar40,uVar37);
      return ((int)pBVar23 + (int)uVar37) - iVar38;
    }
LAB_00111d75:
    return ~(uint)puVar40 + iVar11;
  }
  do {
    *(undefined8 *)pBVar23 = *(undefined8 *)puVar40;
    pBVar23 = pBVar23 + 8;
    puVar40 = puVar40 + 4;
  } while (pBVar23 < pBVar22);
  uVar37 = (ulong)*puVar33;
  puVar40 = puVar33 + 1;
  pBVar26 = pBVar22 + -uVar37;
  uVar14 = (ulong)(uVar10 & 0xf);
LAB_00111ebb:
  if ((int)uVar14 == 0xf) {
    uVar10 = 0;
    do {
      uVar7 = *puVar40;
      puVar40 = (ushort *)((long)puVar40 + 1);
      uVar10 = uVar10 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff && puVar40 < puVar1 + -2);
    uVar14 = (ulong)uVar10 + 0xf;
    if ((puVar1 + -2 <= puVar40) || (CARRY8((ulong)pBVar22,uVar14))) goto LAB_00111d75;
  }
  __n = uVar14 + 4;
  goto LAB_00111f18;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}